

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswClass.c
# Opt level: O1

int Ssw_ClassesRefineOneClass(Ssw_Cla_t *p,Aig_Obj_t *pReprOld,int fRecursive)

{
  uint uVar1;
  int iVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t **ppAVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t **ppAVar6;
  Aig_Obj_t **ppAVar7;
  int iVar8;
  void **ppvVar9;
  long lVar10;
  Vec_Ptr_t *pVVar11;
  Aig_Obj_t *pAVar12;
  long lVar13;
  int local_38;
  int local_34;
  
  local_38 = 0;
  local_34 = fRecursive;
  do {
    p->vClassOld->nSize = 0;
    p->vClassNew->nSize = 0;
    lVar10 = (long)pReprOld->Id;
    if (0 < p->pClassSizes[lVar10]) {
      lVar13 = 0;
      do {
        pAVar3 = p->pId2Class[lVar10][lVar13];
        if (pAVar3 != (Aig_Obj_t *)0x0) {
          iVar8 = (*p->pFuncNodesAreEqual)(p->pManData,pReprOld,pAVar3);
          if (iVar8 == 0) {
            pVVar11 = p->vClassNew;
          }
          else {
            pVVar11 = p->vClassOld;
          }
          uVar1 = pVVar11->nCap;
          if (pVVar11->nSize == uVar1) {
            if ((int)uVar1 < 0x10) {
              if (pVVar11->pArray == (void **)0x0) {
                ppvVar9 = (void **)malloc(0x80);
              }
              else {
                ppvVar9 = (void **)realloc(pVVar11->pArray,0x80);
              }
              pVVar11->pArray = ppvVar9;
              iVar8 = 0x10;
            }
            else {
              iVar8 = uVar1 * 2;
              if (iVar8 <= (int)uVar1) goto LAB_005dd547;
              if (pVVar11->pArray == (void **)0x0) {
                ppvVar9 = (void **)malloc((ulong)uVar1 << 4);
              }
              else {
                ppvVar9 = (void **)realloc(pVVar11->pArray,(ulong)uVar1 << 4);
              }
              pVVar11->pArray = ppvVar9;
            }
            pVVar11->nCap = iVar8;
          }
LAB_005dd547:
          iVar8 = pVVar11->nSize;
          pVVar11->nSize = iVar8 + 1;
          pVVar11->pArray[iVar8] = pAVar3;
        }
        lVar13 = lVar13 + 1;
        lVar10 = (long)pReprOld->Id;
      } while (lVar13 < p->pClassSizes[lVar10]);
    }
    iVar8 = p->vClassNew->nSize;
    if (iVar8 == 0) {
      iVar8 = 0;
LAB_005dd743:
      return local_38 + iVar8;
    }
    if (iVar8 < 1) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    if (p->vClassOld->nSize < 1) {
      __assert_fail("Vec_PtrSize(p->vClassOld) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswClass.c"
                    ,0x3e1,"int Ssw_ClassesRefineOneClass(Ssw_Cla_t *, Aig_Obj_t *, int)");
    }
    ppAVar4 = p->pId2Class[lVar10];
    if (ppAVar4 == (Aig_Obj_t **)0x0) {
      __assert_fail("pClass != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswClass.c"
                    ,0x77,"Aig_Obj_t **Ssw_ObjRemoveClass(Ssw_Cla_t *, Aig_Obj_t *)");
    }
    pAVar3 = (Aig_Obj_t *)*p->vClassNew->pArray;
    p->pId2Class[lVar10] = (Aig_Obj_t **)0x0;
    iVar8 = p->pClassSizes[lVar10];
    if (iVar8 < 2) {
      __assert_fail("nSize > 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswClass.c"
                    ,0x7a,"Aig_Obj_t **Ssw_ObjRemoveClass(Ssw_Cla_t *, Aig_Obj_t *)");
    }
    p->nClasses = p->nClasses + -1;
    p->nLits = (p->nLits - iVar8) + 1;
    p->pClassSizes[lVar10] = 0;
    pVVar11 = p->vClassOld;
    if (pVVar11->nSize < 1) {
      lVar10 = 0;
    }
    else {
      lVar10 = 0;
      do {
        pAVar5 = (Aig_Obj_t *)pVVar11->pArray[lVar10];
        ppAVar4[lVar10] = pAVar5;
        ppAVar6 = p->pAig->pReprs;
        if (ppAVar6 == (Aig_Obj_t **)0x0) goto LAB_005dd757;
        pAVar12 = pReprOld;
        if (lVar10 == 0) {
          pAVar12 = (Aig_Obj_t *)0x0;
        }
        ppAVar6[pAVar5->Id] = pAVar12;
        lVar10 = lVar10 + 1;
        pVVar11 = p->vClassOld;
      } while (lVar10 < pVVar11->nSize);
    }
    ppAVar6 = ppAVar4 + lVar10;
    pVVar11 = p->vClassNew;
    if (0 < pVVar11->nSize) {
      lVar10 = 0;
      do {
        pAVar5 = (Aig_Obj_t *)pVVar11->pArray[lVar10];
        ppAVar6[lVar10] = pAVar5;
        ppAVar7 = p->pAig->pReprs;
        if (ppAVar7 == (Aig_Obj_t **)0x0) {
LAB_005dd757:
          __assert_fail("p->pReprs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aig.h"
                        ,0x14b,"void Aig_ObjSetRepr(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
        }
        pAVar12 = pAVar3;
        if (lVar10 == 0) {
          pAVar12 = (Aig_Obj_t *)0x0;
        }
        ppAVar7[pAVar5->Id] = pAVar12;
        lVar10 = lVar10 + 1;
        pVVar11 = p->vClassNew;
      } while (lVar10 < pVVar11->nSize);
    }
    iVar8 = p->vClassOld->nSize;
    if (1 < iVar8) {
      iVar2 = pReprOld->Id;
      if (p->pId2Class[iVar2] != (Aig_Obj_t **)0x0) goto LAB_005dd830;
      if (*ppAVar4 != pReprOld) goto LAB_005dd7f2;
      p->pId2Class[iVar2] = ppAVar4;
      if (p->pClassSizes[iVar2] != 0) goto LAB_005dd811;
      p->pClassSizes[iVar2] = iVar8;
      p->nClasses = p->nClasses + 1;
      p->nLits = p->nLits + iVar8 + -1;
    }
    iVar8 = p->vClassNew->nSize;
    if (1 < iVar8) {
      iVar2 = pAVar3->Id;
      if (p->pId2Class[iVar2] != (Aig_Obj_t **)0x0) {
LAB_005dd830:
        __assert_fail("p->pId2Class[pRepr->Id] == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswClass.c"
                      ,0x5e,"void Ssw_ObjAddClass(Ssw_Cla_t *, Aig_Obj_t *, Aig_Obj_t **, int)");
      }
      if (*ppAVar6 != pAVar3) {
LAB_005dd7f2:
        __assert_fail("pClass[0] == pRepr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswClass.c"
                      ,0x5f,"void Ssw_ObjAddClass(Ssw_Cla_t *, Aig_Obj_t *, Aig_Obj_t **, int)");
      }
      p->pId2Class[iVar2] = ppAVar6;
      if (p->pClassSizes[iVar2] != 0) {
LAB_005dd811:
        __assert_fail("p->pClassSizes[pRepr->Id] == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswClass.c"
                      ,0x61,"void Ssw_ObjAddClass(Ssw_Cla_t *, Aig_Obj_t *, Aig_Obj_t **, int)");
      }
      p->pClassSizes[iVar2] = iVar8;
      p->nClasses = p->nClasses + 1;
      p->nLits = iVar8 + p->nLits + -1;
    }
    iVar8 = 1;
    if ((local_34 == 0) || (p->vClassNew->nSize < 2)) goto LAB_005dd743;
    local_38 = local_38 + 1;
    local_34 = 1;
    pReprOld = pAVar3;
  } while( true );
}

Assistant:

int Ssw_ClassesRefineOneClass( Ssw_Cla_t * p, Aig_Obj_t * pReprOld, int fRecursive )
{
    Aig_Obj_t ** pClassOld, ** pClassNew;
    Aig_Obj_t * pObj, * pReprNew;
    int i;

    // split the class
    Vec_PtrClear( p->vClassOld );
    Vec_PtrClear( p->vClassNew );
    Ssw_ClassForEachNode( p, pReprOld, pObj, i )
        if ( p->pFuncNodesAreEqual(p->pManData, pReprOld, pObj) )
            Vec_PtrPush( p->vClassOld, pObj );
        else
            Vec_PtrPush( p->vClassNew, pObj );
    // check if splitting happened
    if ( Vec_PtrSize(p->vClassNew) == 0 )
        return 0;
    // remember that this class is refined
//    Ssw_ClassForEachNode( p, pReprOld, pObj, i )
//        Vec_PtrPush( p->vRefined, pObj );

    // get the new representative
    pReprNew = (Aig_Obj_t *)Vec_PtrEntry( p->vClassNew, 0 );
    assert( Vec_PtrSize(p->vClassOld) > 0 );
    assert( Vec_PtrSize(p->vClassNew) > 0 );

    // create old class
    pClassOld = Ssw_ObjRemoveClass( p, pReprOld );
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vClassOld, pObj, i )
    {
        pClassOld[i] = pObj;
        Aig_ObjSetRepr( p->pAig, pObj, i? pReprOld : NULL );
    }
    // create new class
    pClassNew = pClassOld + i;
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vClassNew, pObj, i )
    {
        pClassNew[i] = pObj;
        Aig_ObjSetRepr( p->pAig, pObj, i? pReprNew : NULL );
    }

    // put classes back
    if ( Vec_PtrSize(p->vClassOld) > 1 )
        Ssw_ObjAddClass( p, pReprOld, pClassOld, Vec_PtrSize(p->vClassOld) );
    if ( Vec_PtrSize(p->vClassNew) > 1 )
        Ssw_ObjAddClass( p, pReprNew, pClassNew, Vec_PtrSize(p->vClassNew) );

    // check if the class should be recursively refined
    if ( fRecursive && Vec_PtrSize(p->vClassNew) > 1 )
        return 1 + Ssw_ClassesRefineOneClass( p, pReprNew, 1 );
    return 1;
}